

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void discrete_dist_test_streamable<trng::binomial_dist>(binomial_dist *d)

{
  bool bVar1;
  bool bVar2;
  param_type p_new;
  binomial_dist d_new;
  AssertionHandler catchAssertionHandler;
  stringstream str;
  param_type local_298;
  SourceLineInfo local_270;
  double local_260;
  int local_258;
  vector<double,_std::allocator<double>_> local_250;
  AssertionHandler local_238;
  ITransientExpression local_1f0;
  binomial_dist *local_1e0;
  char *local_1d8;
  size_t sStack_1d0;
  double *local_1c8;
  StringRef local_1c0;
  stringstream local_1b0 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1a0 [112];
  ios_base local_130 [264];
  
  local_298.p_ = 0.5;
  local_298.n_ = 0;
  local_298.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_298.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_298.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream(local_1b0);
  trng::operator<<(local_1a0,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1b0,&local_298);
  local_258 = local_298.n_;
  local_260 = local_298.p_;
  std::vector<double,_std::allocator<double>_>::vector(&local_250,&local_298.P_);
  local_1f0._vptr_ITransientExpression = (_func_int **)0x2a6457;
  local_1f0.m_isBinaryExpression = true;
  local_1f0.m_result = false;
  local_1f0._10_6_ = 0;
  local_270.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_270.line = 0x127;
  Catch::StringRef::StringRef(&local_1c0,"d == d_new");
  Catch::AssertionHandler::AssertionHandler
            (&local_238,(StringRef *)&local_1f0,&local_270,local_1c0,Normal);
  bVar1 = (d->P).p_ == local_260;
  bVar2 = (d->P).n_ == local_258;
  Catch::StringRef::StringRef((StringRef *)&local_270,"==");
  local_1f0.m_result = bVar2 && bVar1;
  local_1f0.m_isBinaryExpression = true;
  local_1f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_003183f8;
  local_1d8 = local_270.file;
  sStack_1d0 = local_270.line;
  local_1e0 = d;
  local_1c8 = &local_260;
  Catch::AssertionHandler::handleExpr(&local_238,&local_1f0);
  Catch::ITransientExpression::~ITransientExpression(&local_1f0);
  Catch::AssertionHandler::complete(&local_238);
  if (local_238.m_completed == false) {
    (*(local_238.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_298.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void discrete_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE(d == d_new);
}